

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapepiram.cpp
# Opt level: O1

void pzshape::TPZShapePiram::Shape
               (TPZVec<double> *pt,TPZVec<long> *id,TPZVec<int> *order,TPZFMatrix<double> *phi,
               TPZFMatrix<double> *dphi)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double *pdVar8;
  long *plVar9;
  _func_int **pp_Var10;
  bool bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  long lVar15;
  int xj;
  long lVar16;
  long lVar17;
  long lVar18;
  TPZVec<double> *pTVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  long lVar23;
  int xj_2;
  int xj_1;
  long lVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  undefined1 auVar31 [16];
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  undefined1 auVar42 [16];
  TPZManVector<double,_1> outvalvec;
  TPZFMatrix<double> dphin_1;
  TPZFMatrix<double> phin_1;
  TPZVec<long> ids;
  TPZFNMatrix<40,_double> dphin;
  TPZFNMatrix<40,_double> phin;
  TPZFNMatrix<100,_double> phiblend;
  TPZFNMatrix<100,_double> dphiblend;
  long local_ea8;
  long local_e98;
  long local_e70;
  int (*local_e50) [4];
  TPZVec<double> local_e28;
  double local_e08;
  TPZVec<double> *local_e00;
  TPZVec<long> *local_df8;
  TPZFMatrix<double> local_df0;
  _func_int **local_d60;
  TPZFMatrix<double> local_d58;
  double *local_cc8;
  double *local_cc0;
  TPZVec<long> local_cb8;
  undefined1 local_c98 [16];
  long lStack_c88;
  ushort local_c80;
  double *local_c78;
  double *local_c70;
  int64_t local_c68;
  undefined1 local_c60 [16];
  undefined1 local_c50 [16];
  int local_c40 [6];
  undefined **local_c28;
  undefined1 local_c20 [16];
  int64_t local_c10;
  double local_c08 [62];
  undefined1 local_a18 [72];
  undefined1 local_9d0 [16];
  int local_9c0 [6];
  undefined **local_9a8;
  undefined1 local_9a0 [16];
  int64_t local_990;
  double local_988 [61];
  TPZFMatrix<double> local_7a0;
  double local_710 [101];
  TPZFMatrix<double> local_3e8;
  double local_358 [101];
  
  local_df8 = id;
  pztopology::TPZPyramid::CornerShape(pt,phi,dphi);
  bVar11 = true;
  lVar18 = 0;
  do {
    if (1 < order->fStore[lVar18]) {
      bVar11 = false;
    }
    lVar18 = lVar18 + 1;
  } while (lVar18 != 0xe);
  if (!bVar11) {
    local_7a0.fElem = local_710;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0x13;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_7a0.fSize = 100;
    local_e00 = pt;
    local_7a0.fGiven = local_7a0.fElem;
    TPZVec<int>::TPZVec(&local_7a0.fPivot.super_TPZVec<int>,0);
    local_7a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_7a0.fPivot.super_TPZVec<int>.fStore = local_7a0.fPivot.fExtAlloc;
    local_7a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_7a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_7a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_7a0.fWork.fStore = (double *)0x0;
    local_7a0.fWork.fNElements = 0;
    local_7a0.fWork.fNAlloc = 0;
    local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    local_3e8.fElem = local_358;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 0x13;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0185f360;
    local_3e8.fSize = 100;
    pTVar19 = (TPZVec<double> *)&local_3e8.fPivot;
    local_3e8.fGiven = local_3e8.fElem;
    TPZVec<int>::TPZVec((TPZVec<int> *)pTVar19,0);
    local_3e8.fPivot.super_TPZVec<int>.fStore = local_3e8.fPivot.fExtAlloc;
    local_3e8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3e8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3e8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3e8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3e8.fWork.fStore = (double *)0x0;
    local_3e8.fWork.fNElements = 0;
    local_3e8.fWork.fNAlloc = 0;
    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0185f070;
    lVar18 = 0;
    lVar23 = 0;
    do {
      if (((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar23) ||
         ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
         (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
        TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      local_7a0.fElem[lVar23] = phi->fElem[lVar23];
      lVar16 = 0;
      do {
        if (((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar16) ||
           ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar16) ||
           (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
          TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined8 *)
         ((long)local_3e8.fElem +
         lVar16 * 8 + local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar18) =
             *(undefined8 *)
              ((long)dphi->fElem +
              lVar16 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar18);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
      lVar23 = lVar23 + 1;
      lVar18 = lVar18 + 8;
    } while (lVar23 != 5);
    ShapeGenerating(pTVar19,&local_7a0,&local_3e8);
    local_ea8 = 5;
    local_e70 = 0x28;
    lVar18 = 0;
    pTVar19 = local_e00;
    do {
      if (1 < order->fStore[lVar18]) {
        pdVar8 = pTVar19->fStore;
        dVar1 = (double)(&gRibTrans3dPiram1d)[lVar18 * 3];
        dVar2 = (double)(&DAT_01a58608)[lVar18 * 3];
        dVar3 = pdVar8[1];
        dVar4 = *pdVar8;
        dVar5 = (double)(&DAT_01a58610)[lVar18 * 3];
        dVar6 = pdVar8[2];
        TPZVec<long>::TPZVec(&local_cb8,2);
        TPZVec<double>::TPZVec(&local_e28,0);
        local_e08 = dVar5 * dVar6 + dVar1 * dVar4 + dVar2 * dVar3;
        local_e28._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018df490;
        local_e28.fNElements = 1;
        local_e28.fNAlloc = 0;
        iVar7 = pztopology::TPZPyramid::SideNodes[lVar18][1];
        plVar9 = local_df8->fStore;
        *local_cb8.fStore = plVar9[pztopology::TPZPyramid::SideNodes[lVar18][0]];
        local_cb8.fStore[1] = plVar9[iVar7];
        iVar7 = order->fStore[lVar18];
        uVar25 = iVar7 - 1;
        lVar23 = (long)(int)uVar25;
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0183c898;
        local_d58.fElem = (double *)local_c98;
        local_d58.fSize = 0x14;
        local_e28.fStore = &local_e08;
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar23;
        local_d58.fGiven = local_d58.fElem;
        TPZVec<int>::TPZVec(&local_d58.fPivot.super_TPZVec<int>,0);
        local_d58.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_d58.fPivot.super_TPZVec<int>.fStore = local_d58.fPivot.fExtAlloc;
        local_d58.fPivot.super_TPZVec<int>.fNElements = 0;
        local_d58.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_d58.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        local_d58.fWork.fStore = (double *)0x0;
        local_d58.fWork.fNElements = 0;
        local_d58.fWork.fNAlloc = 0;
        if (uVar25 == 0) {
          local_d58.fElem = (double *)0x0;
        }
        else if (0x15 < iVar7) {
          local_d58.fElem = (double *)operator_new__(lVar23 * 8);
        }
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 3;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
             local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffff0000;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZFMatrix_0183c898;
        local_df0.fElem = (double *)local_a18;
        local_df0.fSize = 0x3c;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar23;
        local_df0.fGiven = local_df0.fElem;
        TPZVec<int>::TPZVec(&local_df0.fPivot.super_TPZVec<int>,0);
        local_df0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
        local_df0.fPivot.super_TPZVec<int>.fStore = local_df0.fPivot.fExtAlloc;
        local_df0.fPivot.super_TPZVec<int>.fNElements = 0;
        local_df0.fPivot.super_TPZVec<int>.fNAlloc = 0;
        local_df0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        local_df0.fWork.fStore = (double *)0x0;
        local_df0.fWork.fNElements = 0;
        local_df0.fWork.fNAlloc = 0;
        if (uVar25 == 0) {
          local_df0.fElem = (double *)0x0;
        }
        else if (0x15 < iVar7) {
          uVar20 = lVar23 * 0x18;
          if (0x1fffffffffffffff < (ulong)(lVar23 * 3)) {
            uVar20 = 0xffffffffffffffff;
          }
          local_df0.fElem = (double *)operator_new__(uVar20);
        }
        memset(local_d58.fElem,0,
               local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ =
             local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix._24_2_ & 0xff00;
        memset(local_df0.fElem,0,
               local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow *
               local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol * 8);
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ =
             local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._24_8_ & 0xffffffffffffff00;
        iVar22 = order->fStore[lVar18];
        iVar12 = TPZShapeLinear::GetTransformId1d(&local_cb8);
        TPZShapeLinear::ShapeInternal(&local_e28,iVar22,&local_d58,&local_df0,iVar12);
        TransformDerivativeFromRibToPiram((int)lVar18,uVar25,&local_df0);
        if (1 < iVar7) {
          lVar23 = lVar18 + 5;
          local_ea8 = (long)(int)local_ea8;
          lVar16 = local_ea8 * 8;
          lVar15 = 0;
          uVar20 = 0;
          do {
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar20) ||
               (local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((local_ea8 < 0) ||
                ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea8)) ||
               ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[local_ea8] = local_7a0.fElem[lVar18 + 5] * local_d58.fElem[uVar20];
            lVar17 = 0;
            do {
              if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                 (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar20) ||
                 (local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
                 (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar17) ||
                 (local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar20)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar17) ||
                  (local_ea8 < 0)) ||
                 ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea8)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(double *)
               ((long)dphi->fElem +
               lVar17 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16) =
                   *(double *)
                    ((long)local_3e8.fElem +
                    lVar17 * 8 +
                    local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e70) *
                   local_d58.fElem[uVar20] +
                   local_7a0.fElem[lVar18 + 5] *
                   *(double *)
                    ((long)local_df0.fElem +
                    lVar17 * 8 + local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * lVar15
                    );
              lVar17 = lVar17 + 1;
            } while (lVar17 != 3);
            local_ea8 = local_ea8 + 1;
            uVar20 = uVar20 + 1;
            lVar15 = lVar15 + 8;
            lVar16 = lVar16 + 8;
            pTVar19 = local_e00;
          } while (uVar20 != uVar25);
        }
        TPZFMatrix<double>::~TPZFMatrix(&local_df0);
        TPZFMatrix<double>::~TPZFMatrix(&local_d58);
        if (local_e28.fStore == &local_e08) {
          local_e28.fStore = (double *)0x0;
        }
        local_e28.fNAlloc = 0;
        local_e28._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
        if (local_e28.fStore != (double *)0x0) {
          operator_delete__(local_e28.fStore);
        }
        local_cb8._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
        if (local_cb8.fStore != (long *)0x0) {
          operator_delete__(local_cb8.fStore);
        }
      }
      lVar18 = lVar18 + 1;
      local_e70 = local_e70 + 8;
    } while (lVar18 != 8);
    local_cc0 = local_988;
    local_cc8 = local_c08;
    local_e70 = 0x68;
    local_d60 = (_func_int **)&PTR__TPZFNMatrix_0183ec70;
    local_e50 = pztopology::TPZPyramid::FaceNodes;
    uVar20 = 0;
    do {
      if ((1 < order->fStore[uVar20 + 8]) && (uVar20 == 0 || order->fStore[uVar20 + 8] != 2)) {
        TPZVec<double>::TPZVec((TPZVec<double> *)&local_df0,0);
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZManVector_01843b78;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = (int64_t)&local_df0.fElem;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 2;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
        ProjectPoint3dPiramToFace((int)uVar20,pTVar19,(TPZVec<double> *)&local_df0);
        iVar7 = order->fStore[uVar20 | 8];
        if (uVar20 == 0 || 2 < iVar7) {
          if (uVar20 == 0) {
            iVar22 = (iVar7 + -1) * (iVar7 + -1);
          }
          else {
            iVar22 = ((iVar7 + -1) * (iVar7 + -2)) / 2;
          }
          lVar18 = (long)iVar22;
          local_a18._16_8_ = 1;
          local_a18._8_8_ = lVar18;
          local_a18._24_2_ = 0;
          local_a18._0_8_ = &PTR__TPZFMatrix_0183ef60;
          local_a18._32_8_ = local_cc0;
          local_a18._40_8_ = local_cc0;
          local_a18._48_8_ = 0x3c;
          TPZVec<int>::TPZVec((TPZVec<int> *)(local_a18 + 0x38),0);
          pp_Var10 = local_d60;
          local_a18._56_8_ = &PTR__TPZManVector_0183cde8;
          local_a18._64_8_ = local_9c0;
          local_9d0 = ZEXT816(0);
          local_9a8 = &PTR__TPZVec_0183b4b0;
          local_9a0 = ZEXT816(0);
          local_990 = 0;
          if (iVar22 == 0) {
            local_a18._32_8_ = (double *)0x0;
          }
          else if (0x3c < iVar22) {
            local_a18._32_8_ = operator_new__(lVar18 * 8);
          }
          local_a18._0_8_ = pp_Var10;
          lStack_c88 = lVar18;
          local_c98._8_8_ = 3;
          local_c80 = 0;
          local_c98._0_8_ = &PTR__TPZFMatrix_0183ef60;
          local_c78 = local_cc8;
          local_c70 = local_cc8;
          local_c68 = 0x3c;
          TPZVec<int>::TPZVec((TPZVec<int> *)local_c60,0);
          local_c60._0_8_ = &PTR__TPZManVector_0183cde8;
          local_c60._8_8_ = local_c40;
          local_c50 = ZEXT816(0);
          local_c28 = &PTR__TPZVec_0183b4b0;
          local_c20 = ZEXT816(0);
          local_c10 = 0;
          if (iVar22 == 0) {
            local_c78 = (double *)0x0;
          }
          else if (0x14 < iVar22) {
            uVar21 = lVar18 * 0x18;
            if (0x1fffffffffffffff < (ulong)(lVar18 * 3)) {
              uVar21 = 0xffffffffffffffff;
            }
            local_c78 = (double *)operator_new__(uVar21);
          }
          local_c98._0_8_ = pp_Var10;
          memset((void *)local_a18._32_8_,0,local_a18._8_8_ * local_a18._16_8_ * 8);
          local_a18._24_2_ = local_a18._24_2_ & 0xff00;
          memset(local_c78,0,local_c98._8_8_ * lStack_c88 * 8);
          local_c80 = local_c80 & 0xff00;
          TPZManVector<long,_10>::TPZManVector((TPZManVector<long,_10> *)&local_d58,4);
          if (uVar20 == 0) {
            plVar9 = local_df8->fStore;
            lVar23 = 0;
            do {
              *(long *)(local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar23 * 8) =
                   plVar9[pztopology::TPZPyramid::FaceNodes[0][lVar23]];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 4);
          }
          else {
            plVar9 = local_df8->fStore;
            lVar23 = 0;
            do {
              *(long *)(local_d58.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + lVar23 * 8) =
                   plVar9[(*local_e50)[lVar23]];
              lVar23 = lVar23 + 1;
            } while (lVar23 != 3);
          }
          if (uVar20 == 0) {
            iVar12 = TPZShapeQuad::GetTransformId2dQ((TPZVec<long> *)&local_d58);
            TPZShapeQuad::ShapeInternal
                      ((TPZVec<double> *)&local_df0,iVar7 + -2,(TPZFMatrix<double> *)local_a18,
                       (TPZFMatrix<double> *)local_c98,iVar12);
          }
          else {
            TPZManVector<long,_10>::Resize((TPZManVector<long,_10> *)&local_d58,3);
            iVar12 = TPZShapeTriang::GetTransformId2dT((TPZVec<long> *)&local_d58);
            *(double **)local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow =
                 (double *)
                 (((double)*(double **)local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow +
                  1.0) * 0.5);
            *(double **)(local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) =
                 (double *)
                 (((double)*(double **)
                            (local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow + 8) + 1.0)
                 * 0.5);
            TPZShapeTriang::ShapeInternal
                      ((TPZVec<double> *)&local_df0,iVar7 + -2,(TPZFMatrix<double> *)local_a18,
                       (TPZFMatrix<double> *)local_c98,iVar12);
            if (0 < (int)local_c98._16_4_) {
              uVar21 = 0;
              do {
                if (((long)local_c98._8_8_ < 1) || (lStack_c88 <= (long)uVar21)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_c78[local_c98._8_8_ * uVar21] = local_c78[local_c98._8_8_ * uVar21] * 0.5;
                if (((long)local_c98._8_8_ < 2) || (lStack_c88 <= (long)uVar21)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_c78[local_c98._8_8_ * uVar21 + 1] =
                     local_c78[local_c98._8_8_ * uVar21 + 1] * 0.5;
                if (((long)local_c98._8_8_ < 3) || (lStack_c88 <= (long)uVar21)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                local_c78[local_c98._8_8_ * uVar21 + 2] =
                     local_c78[local_c98._8_8_ * uVar21 + 2] * 0.5;
                uVar21 = uVar21 + 1;
              } while ((local_c98._16_4_ & 0x7fffffff) != uVar21);
            }
          }
          TransformDerivativeFromFaceToPiram((int)uVar20,iVar22,(TPZFMatrix<double> *)local_c98);
          if (0 < iVar22) {
            lVar23 = uVar20 + 0xd;
            local_ea8 = (long)(int)local_ea8;
            lVar16 = local_ea8 * 8;
            lVar15 = 0;
            lVar17 = 0;
            do {
              if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
                 (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((long)local_a18._8_8_ <= lVar17) || ((long)local_a18._16_8_ < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              if (((local_ea8 < 0) ||
                  ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_ea8)) ||
                 ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
                TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              phi->fElem[local_ea8] =
                   local_7a0.fElem[uVar20 + 0xd] * *(double *)(local_a18._32_8_ + lVar17 * 8);
              lVar24 = 0;
              do {
                if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar24) ||
                   (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= lVar23)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((long)local_a18._8_8_ <= lVar17) || ((long)local_a18._16_8_ < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
                   (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if (((long)local_c98._8_8_ <= lVar24) || (lStack_c88 <= lVar17)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar24) ||
                    (local_ea8 < 0)) ||
                   ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_ea8)) {
                  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(double *)
                 ((long)dphi->fElem +
                 lVar24 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar16) =
                     *(double *)
                      ((long)local_3e8.fElem +
                      lVar24 * 8 +
                      local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * local_e70) *
                     *(double *)(local_a18._32_8_ + lVar17 * 8) +
                     local_7a0.fElem[uVar20 + 0xd] *
                     *(double *)((long)local_c78 + lVar24 * 8 + local_c98._8_8_ * lVar15);
                lVar24 = lVar24 + 1;
              } while (lVar24 != 3);
              local_ea8 = local_ea8 + 1;
              lVar17 = lVar17 + 1;
              lVar15 = lVar15 + 8;
              lVar16 = lVar16 + 8;
            } while (lVar17 != lVar18);
          }
          TPZManVector<long,_10>::~TPZManVector((TPZManVector<long,_10> *)&local_d58);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_c98,&PTR_PTR_0183ef28);
          TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_a18,&PTR_PTR_0183ef28);
          pTVar19 = local_e00;
        }
        if ((double **)local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow ==
            &local_df0.fElem) {
          local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 0;
        }
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix._26_6_ = 0;
        local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
             (_func_int **)&PTR__TPZVec_0183b4b0;
        if ((double **)local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow != (double **)0x0)
        {
          operator_delete__((void *)local_df0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow);
        }
      }
      uVar20 = uVar20 + 1;
      local_e50 = local_e50 + 1;
      local_e70 = local_e70 + 8;
    } while (uVar20 != 5);
    iVar7 = order->fStore[0xd];
    if (2 < iVar7) {
      uVar13 = iVar7 + 1U & 0xfffffffc;
      uVar14 = iVar7 - 3;
      uVar25 = 0;
      uVar26 = 1;
      uVar27 = 2;
      uVar28 = 3;
      uVar30 = 0;
      uVar33 = 0;
      uVar35 = 0;
      uVar37 = 0;
      do {
        uVar36 = uVar37;
        uVar34 = uVar35;
        uVar32 = uVar33;
        uVar29 = uVar30;
        uVar41 = uVar28;
        uVar40 = uVar27;
        uVar39 = uVar26;
        uVar38 = uVar25;
        auVar31._0_4_ = uVar38 + 1;
        auVar31._4_4_ = uVar39 + 1;
        auVar31._8_4_ = uVar40 + 1;
        auVar31._12_4_ = uVar41 + 1;
        auVar42._4_4_ = uVar39 + 2;
        auVar42._12_4_ = uVar41 + 2;
        auVar42._0_4_ = auVar42._4_4_;
        auVar42._8_4_ = auVar42._12_4_;
        uVar30 = (auVar31._0_4_ * (uVar38 + 2) >> 1) + uVar29;
        uVar33 = ((uint)(auVar42._4_4_ * auVar31._4_4_) >> 1) + uVar32;
        uVar35 = ((uint)((auVar31._8_8_ & 0xffffffff) * (ulong)(uVar40 + 2)) >> 1) + uVar34;
        uVar37 = ((uint)((auVar42._8_8_ & 0xffffffff) * (ulong)auVar31._12_4_) >> 1) + uVar36;
        uVar13 = uVar13 - 4;
        uVar25 = uVar38 + 4;
        uVar26 = uVar39 + 4;
        uVar27 = uVar40 + 4;
        uVar28 = uVar41 + 4;
      } while (uVar13 != 0);
      uVar25 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar38 ^ 0x80000000));
      uVar26 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
      uVar27 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar40 ^ 0x80000000));
      uVar28 = -(uint)((int)(uVar14 ^ 0x80000000) < (int)(uVar41 ^ 0x80000000));
      uVar25 = (~uVar28 & uVar37 | uVar36 & uVar28) + (~uVar26 & uVar33 | uVar32 & uVar26) +
               (~uVar27 & uVar35 | uVar34 & uVar27) + (~uVar25 & uVar30 | uVar29 & uVar25);
      uVar20 = CONCAT44(0,uVar25);
      local_a18._32_8_ = local_988;
      local_a18._16_8_ = 1;
      local_a18._8_8_ = uVar20;
      local_a18._24_2_ = 0;
      local_a18._0_8_ = &PTR__TPZFMatrix_018df930;
      local_a18._48_8_ = 0x28;
      local_a18._40_8_ = local_a18._32_8_;
      TPZVec<int>::TPZVec((TPZVec<int> *)(local_a18 + 0x38),0);
      local_a18._56_8_ = &PTR__TPZManVector_0183cde8;
      local_a18._64_8_ = local_9c0;
      local_9d0 = (undefined1  [16])0x0;
      local_9a8 = &PTR__TPZVec_0183b4b0;
      local_9a0 = (undefined1  [16])0x0;
      local_990 = 0;
      if (uVar25 == 0) {
        local_a18._32_8_ = (double *)0x0;
      }
      else if (0x28 < uVar25) {
        local_a18._32_8_ = operator_new__(uVar20 * 8);
      }
      local_a18._0_8_ = &PTR__TPZFNMatrix_018df640;
      local_c78 = local_c08;
      lStack_c88._0_4_ = uVar25;
      local_c98._8_8_ = 3;
      lStack_c88._4_4_ = 0;
      local_c80 = 0;
      local_c98._0_8_ = &PTR__TPZFMatrix_018df930;
      local_c68 = 0x28;
      local_c70 = local_c78;
      TPZVec<int>::TPZVec((TPZVec<int> *)local_c60,0);
      local_c60._0_8_ = &PTR__TPZManVector_0183cde8;
      local_c60._8_8_ = local_c40;
      local_c50 = (undefined1  [16])0x0;
      local_c28 = &PTR__TPZVec_0183b4b0;
      local_c20 = (undefined1  [16])0x0;
      local_c10 = 0;
      if (uVar25 == 0) {
        local_c78 = (double *)0x0;
      }
      else if (0xd < uVar25) {
        local_c78 = (double *)operator_new__(uVar20 * 0x18);
      }
      local_c98._0_8_ = &PTR__TPZFNMatrix_018df640;
      memset((void *)local_a18._32_8_,0,local_a18._8_8_ * local_a18._16_8_ * 8);
      local_a18._24_2_ = local_a18._24_2_ & 0xff00;
      memset(local_c78,0,local_c98._8_8_ * lStack_c88 * 8);
      local_c80 = local_c80 & 0xff00;
      ShapeInternal(pTVar19,order->fStore[0xd],(TPZFMatrix<double> *)local_a18,
                    (TPZFMatrix<double> *)local_c98);
      if (uVar20 != 0) {
        local_e98 = (long)(int)local_ea8;
        local_ea8 = local_e98 * 8;
        lVar18 = 0;
        uVar21 = 0;
        do {
          if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x13) ||
             (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((long)local_a18._8_8_ <= (long)uVar21) || ((long)local_a18._16_8_ < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if (((local_e98 < 0) ||
              ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= local_e98)) ||
             ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          phi->fElem[local_e98] = local_7a0.fElem[0x12] * *(double *)(local_a18._32_8_ + uVar21 * 8)
          ;
          lVar23 = 0;
          do {
            if ((local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= lVar23) ||
               (local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 0x13)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((long)local_a18._8_8_ <= (long)uVar21) || ((long)local_a18._16_8_ < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 0x13) ||
               (local_7a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if (((long)local_c98._8_8_ <= lVar23) || (lStack_c88 <= (long)uVar21)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar23) ||
                (local_e98 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_e98)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(double *)
             ((long)dphi->fElem +
             lVar23 * 8 + (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_ea8) =
                 local_3e8.fElem
                 [local_3e8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * 0x12 + lVar23] *
                 *(double *)(local_a18._32_8_ + uVar21 * 8) +
                 local_7a0.fElem[0x12] *
                 *(double *)((long)local_c78 + lVar23 * 8 + local_c98._8_8_ * lVar18);
            lVar23 = lVar23 + 1;
          } while (lVar23 != 3);
          local_e98 = local_e98 + 1;
          uVar21 = uVar21 + 1;
          lVar18 = lVar18 + 8;
          local_ea8 = local_ea8 + 8;
        } while (uVar21 != uVar20);
      }
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_c98,&PTR_PTR_018df8f8);
      TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)local_a18,&PTR_PTR_018df8f8);
    }
    TPZFMatrix<double>::~TPZFMatrix(&local_3e8,&PTR_PTR_0185f328);
    TPZFMatrix<double>::~TPZFMatrix(&local_7a0,&PTR_PTR_0185f328);
  }
  return;
}

Assistant:

void TPZShapePiram::Shape(TPZVec<REAL> &pt, TPZVec<int64_t> &id, TPZVec<int> &order, TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &dphi) {
		
		CornerShape(pt,phi,dphi);
		bool linear = true;
		int is,d;
        for(is=NCornerNodes; is<NSides; is++){
            if(order[is-NCornerNodes] > 1){
                linear = false;
            }
        }
		if(linear) return;
		
		TPZFNMatrix<100> phiblend(NSides,1),dphiblend(Dimension,NSides);
		for(is=0; is<NCornerNodes; is++)
		{
			phiblend(is,0) = phi(is,0);
			for(d=0; d<Dimension; d++)
			{
				dphiblend(d,is) = dphi(d,is);
			}
		}
		ShapeGenerating(pt,phiblend,dphiblend);
		//  if(order[13]<2) return;//order tem as ordens dos lados do elemento
		int shape = 5;
		//rib shapes
		for (int rib = 0; rib < 8; rib++) {//todas as arestas
			if (order[rib] <2 ) continue;
			REAL outval;
			ProjectPoint3dPiramToRib(rib,pt,outval);
			TPZVec<int64_t> ids(2);
			TPZManVector<REAL,1> outvalvec(1,outval);
			int id0,id1;
			id0 = SideNodes[rib][0];
			id1 = SideNodes[rib][1];
			ids[0] = id[id0];
			ids[1] = id[id1];
			REAL store1[20],store2[60];
			int nshape = order[rib]-1;//three orders : order in x , order in y and order in z
			TPZFMatrix<REAL> phin(nshape,1,store1,20),dphin(3,nshape,store2,60);
			phin.Zero();
			dphin.Zero();
			TPZShapeLinear::ShapeInternal(outvalvec,order[rib],phin,dphin,TPZShapeLinear::GetTransformId1d(ids));//ordin = ordem de um lado
			TransformDerivativeFromRibToPiram(rib,nshape,dphin);
			for (int i = 0; i < nshape; i++) {
				phi(shape,0) = phiblend(rib+5,0)*phin(i,0);
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj ,rib+5) * phin( i, 0) +
					phiblend(rib+5, 0 )  * dphin(xj,i);
				}
				shape++;
			}
		}

		for (int face = 0; face < 5; face++) {
			if (order[face+8] < 2) continue;
			if(face>0 && order[face+8]<=2) continue;//s� a face 13 tem shape associada com ordem p=2
			TPZManVector<REAL,2> outval(2);
			ProjectPoint3dPiramToFace(face,pt,outval);
			int ord1;//,ord2;
			ord1 = order[8+face];
			//ord2 = ord1;
			//FaceOrder(face,ord1,ord2);//ordem da face
			if(face && ord1<3) continue;//uma face com ordem < 3 n�o tem shape associada
			int nshape;
			if(!face) nshape = (ord1-1)*(ord1-1);//face quadrada
			else nshape = (ord1-2)*(ord1-1)/2;//face triangular
			TPZFNMatrix<60> phin(nshape,1),dphin(3,nshape);//ponto na face
			phin.Zero();
			dphin.Zero();
			TPZManVector<int64_t> ids(4);
			//	int id0,id1,id2;
			int i;
			if(!face) for(i=0;i<4;i++) ids[i] = id[FaceNodes[face][i]];
			else for(i=0;i<3;i++) ids[i] = id[FaceNodes[face][i]];
			//	id0 = ShapeFaceId[face][0];//indice das shapes da face que compoem a shape atual
			//	id1 = ShapeFaceId[face][1];//equivale a FaceIdsCube(face,ids,id,id0,id1);
			// 	id2 = ShapeFaceId[face][2];//if(face == 0) id3 = ShapeFaceId[face][3];
			int transid;
			if(!face) {
				transid = TPZShapeQuad::GetTransformId2dQ(ids);
				TPZShapeQuad::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
			} else {
				ids.Resize(3);
				transid = TPZShapeTriang::GetTransformId2dT(ids);
				outval[0] = (outval[0]+1.)/2.;//devido a corre��o na fun��o
				outval[1] = (outval[1]+1.)/2.;//Shape2dTriangleInternal(..) : correto aqui
				TPZShapeTriang::ShapeInternal(outval,ord1-2,phin,dphin,transid);//ordin = ordem de um lado
				int c = dphin.Cols();//isto da (p-2)(p-1)/2 ; ord1 = p ; correto aqui
				for(int i=0;i<c;i++) {
					dphin(0,i) /= 2.;//correcao da derivada OK! aqui
					dphin(1,i) /= 2.;
					dphin(2,i) /= 2.;
				}
			}
			TransformDerivativeFromFaceToPiram(face,nshape,dphin);//ordin = numero de shapes
			for(i=0;i<nshape;i++)	{
				phi(shape,0) = phiblend(face+13,0)*phin(i,0);//face quadril�teral
				for(int xj=0;xj<3;xj++) {
					dphi(xj,shape) = dphiblend(xj,face+13)* phin(i ,0) +
					phiblend(face+13, 0)*dphin(xj,i);
				}
				shape++;
			}
		}
		if(order[13]<3) return;//n�o h� ordens para cantos
		//volume shapes
		int nshape=0,i;
		for(i=0;i<order[13]-2;i++) {
			nshape += (i+1)*(i+2) / 2;
		}
		TPZFNMatrix<40> phin(nshape,1),dphin(3,nshape);
		phin.Zero();
		dphin.Zero();
		ShapeInternal(pt,order[13],phin,dphin);
		for(i=0;i<nshape;i++)	{
			phi(shape,0) = phiblend(NSides-1,0)*phin(i,0);
			for(int xj=0;xj<3;xj++) {
				dphi(xj,shape) = dphiblend(xj,NSides-1) * phin(i ,0) +
				phiblend(NSides-1, 0) * dphin(xj,i);
			}
			shape++;
		}
	}